

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O1

array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
* detail::operator|(array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
                    *__return_storage_ptr__,b_str<wchar_t> *str,
                   split_helper_subroutine<detail::split_at_first,_wchar_t,_wchar_t> *info)

{
  ulong uVar1;
  long lVar2;
  long *local_40 [2];
  long local_30 [2];
  
  uVar1 = std::__cxx11::wstring::find((wchar_t)str,(ulong)(uint)info->delim);
  if (uVar1 == 0xffffffffffffffff) {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)str);
    __return_storage_ptr__->_M_elems[1]._M_dataplus._M_p =
         (pointer)&__return_storage_ptr__->_M_elems[1].field_2;
    __return_storage_ptr__->_M_elems[1]._M_string_length = 0;
    __return_storage_ptr__->_M_elems[1].field_2._M_local_buf[0] = L'\0';
  }
  else {
    lVar2 = 0x10;
    do {
      *(long *)((long)__return_storage_ptr__->_M_elems + lVar2 + -0x10) =
           (long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar2;
      *(undefined8 *)((long)__return_storage_ptr__->_M_elems + lVar2 + -8) = 0;
      *(undefined4 *)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar2) = 0;
      lVar2 = lVar2 + 0x20;
    } while (lVar2 != 0x50);
    std::__cxx11::wstring::find_first_not_of((wchar_t)str,(ulong)(uint)info->delim);
    std::__cxx11::wstring::substr((ulong)local_40,(ulong)str);
    std::__cxx11::wstring::operator=
              ((wstring *)(__return_storage_ptr__->_M_elems + 1),(wstring *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] * 4 + 4);
    }
    if (str->_M_string_length < uVar1) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar1);
    }
    str->_M_string_length = uVar1;
    (str->_M_dataplus)._M_p[uVar1] = L'\0';
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { std::move(str),{} } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(str.find_first_not_of(info.delim, pos));
		str.erase(pos);
		re[0] = std::move(str);
		return re;
	}